

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetMin.c
# Opt level: O2

Aig_Man_t * Saig_ManRetimeDupInitState(Aig_Man_t *p,Vec_Ptr_t *vCut)

{
  Aig_Man_t *pNew;
  void *pvVar1;
  Aig_Obj_t *pAVar2;
  int iVar3;
  
  pNew = Aig_ManStart(p->vObjs->nSize);
  Aig_ManCleanData(p);
  p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)pNew->pConst1;
  for (iVar3 = 0; iVar3 < vCut->nSize; iVar3 = iVar3 + 1) {
    pvVar1 = Vec_PtrEntry(vCut,iVar3);
    pAVar2 = Aig_ObjCreateCi(pNew);
    *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar2;
  }
  for (iVar3 = 0; iVar3 < p->nRegs; iVar3 = iVar3 + 1) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,p->nTruePos + iVar3);
    Saig_ManRetimeDup_rec(pNew,(Aig_Obj_t *)((ulong)pAVar2->pFanin0 & 0xfffffffffffffffe));
    pAVar2 = Aig_ObjChild0Copy(pAVar2);
    Aig_ObjCreateCo(pNew,pAVar2);
  }
  return pNew;
}

Assistant:

Aig_Man_t * Saig_ManRetimeDupInitState( Aig_Man_t * p, Vec_Ptr_t * vCut )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i;
    // mark the cones under the cut
//    assert( Vec_PtrSize(vCut) == Saig_ManRetimeCountCut(p, vCut) );
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    // create the true PIs
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    // create the registers
    Vec_PtrForEachEntry( Aig_Obj_t *, vCut, pObj, i )
        pObj->pData = Aig_ObjCreateCi(pNew);
    // duplicate logic above the cut and create POs
    Saig_ManForEachLi( p, pObj, i )
    {
        Saig_ManRetimeDup_rec( pNew, Aig_ObjFanin0(pObj) );
        Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    }
    return pNew;
}